

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

QObject * __thiscall QFactoryLoader::instanceHelper_locked(QFactoryLoader *this,int index)

{
  QtPluginInstanceFunction p_Var1;
  QLatin1StringView iid_00;
  QByteArrayView raw;
  bool bVar2;
  ulong uVar3;
  Private *pPVar4;
  size_type sVar5;
  reference pbVar6;
  char *s;
  qsizetype qVar7;
  const_iterator o;
  QStaticPlugin *pQVar8;
  reference pp_Var9;
  int in_ESI;
  Private *in_RDI;
  long in_FS_OFFSET;
  QList<QStaticPlugin> *__range1;
  qsizetype i;
  QLibraryPrivate *library;
  QByteArrayView pluginData;
  QStaticPlugin plugin;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QStaticPlugin> staticPlugins;
  QLatin1StringView iid;
  qsizetype in_stack_fffffffffffffed8;
  QList<QStaticPlugin> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  QByteArrayView *in_stack_fffffffffffffef0;
  QtPluginInstanceFunction p_Var10;
  QLibraryPrivate *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  long local_c0;
  QObject *local_a0;
  const_iterator local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QLatin1String local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (ulong)in_ESI;
  pPVar4 = Private::operator->(in_RDI);
  sVar5 = std::
          vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
          ::size(&pPVar4->libraries);
  if (uVar3 < sVar5) {
    Private::operator->(in_RDI);
    std::
    vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
    ::operator[]((vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                  *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>::get
              ((unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)in_stack_fffffffffffffee0);
    Private::operator->(in_RDI);
    pbVar6 = QList<bool>::operator[]
                       ((QList<bool> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    *pbVar6 = true;
    local_a0 = QLibraryPrivate::pluginInstance(in_stack_ffffffffffffff08);
  }
  else {
    pPVar4 = Private::operator->(in_RDI);
    sVar5 = std::
            vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
            ::size(&pPVar4->libraries);
    local_18.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_18.m_data = &DAT_aaaaaaaaaaaaaaaa;
    Private::operator->(in_RDI);
    s = QByteArray::constData((QByteArray *)0x44a3b8);
    pPVar4 = Private::operator->(in_RDI);
    qVar7 = QByteArray::size(&pPVar4->iid);
    QLatin1String::QLatin1String(&local_18,s,qVar7);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QPluginLoader::staticPlugins();
    local_c0 = 0;
    local_38.i = (QStaticPlugin *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QList<QStaticPlugin>::begin(in_stack_fffffffffffffee0);
    o = QList<QStaticPlugin>::end(in_stack_fffffffffffffee0);
    while (bVar2 = QList<QStaticPlugin>::const_iterator::operator!=(&local_38,o), bVar2) {
      pQVar8 = QList<QStaticPlugin>::const_iterator::operator*(&local_38);
      p_Var1 = pQVar8->instance;
      QByteArrayView::QByteArrayView<char,_true>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (qsizetype)in_stack_fffffffffffffee0);
      raw.m_data._0_4_ = in_stack_ffffffffffffff28;
      raw.m_size = uVar3;
      raw.m_data._4_4_ = in_stack_ffffffffffffff2c;
      iid_00.m_data = (char *)in_RDI;
      iid_00.m_size = (qsizetype)s;
      bVar2 = isIidMatch(raw,iid_00);
      if (bVar2) {
        if (local_c0 == in_ESI - (int)sVar5) {
          pPVar4 = Private::operator->(in_RDI);
          qVar7 = QList<QObject_*(*)()>::size(&pPVar4->usedStaticInstances);
          if (qVar7 <= local_c0) {
            Private::operator->(in_RDI);
            QList<QObject_*(*)()>::resize
                      ((QList<QObject_*(*)()> *)in_stack_fffffffffffffef0,
                       (qsizetype)in_stack_fffffffffffffee8);
          }
          p_Var10 = p_Var1;
          Private::operator->(in_RDI);
          pp_Var9 = QList<QObject_*(*)()>::operator[]
                              ((QList<QObject_*(*)()> *)in_stack_fffffffffffffee0,
                               in_stack_fffffffffffffed8);
          *pp_Var9 = p_Var10;
          local_a0 = (*p_Var1)();
          goto LAB_0044a69c;
        }
        local_c0 = local_c0 + 1;
      }
      QList<QStaticPlugin>::const_iterator::operator++(&local_38);
    }
    local_a0 = (QObject *)0x0;
LAB_0044a69c:
    QList<QStaticPlugin>::~QList((QList<QStaticPlugin> *)0x44a6a9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a0;
}

Assistant:

inline QObject *QFactoryLoader::instanceHelper_locked(int index) const
{
#if QT_CONFIG(library)
    if (size_t(index) < d->libraries.size()) {
        QLibraryPrivate *library = d->libraries[index].get();
        d->loadedLibraries[index] = true;
        return library->pluginInstance();
    }
    // we know d->libraries.size() <= index <= numeric_limits<decltype(index)>::max() → no overflow
    index -= static_cast<int>(d->libraries.size());
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const QList<QStaticPlugin> staticPlugins = QPluginLoader::staticPlugins();
    qsizetype i = 0;
    for (QStaticPlugin plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData), plugin.rawMetaDataSize);
        if (!isIidMatch(pluginData, iid))
            continue;

        if (i == index) {
            if (d->usedStaticInstances.size() <= i)
                d->usedStaticInstances.resize(i + 1);
            d->usedStaticInstances[i] = plugin.instance;
            return plugin.instance();
        }
        ++i;
    }

    return nullptr;
}